

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O1

coda_type_special * coda_type_no_data_singleton(coda_format format)

{
  int iVar1;
  coda_type_special *type;
  coda_type_raw *type_00;
  ulong uVar2;
  long in_FS_OFFSET;
  
  if ((coda_format_rinex|coda_format_xml) < format) {
    __assert_fail("format < num_no_data_singletons",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                  ,0x8ac,"coda_type_special *coda_type_no_data_singleton(coda_format)");
  }
  uVar2 = (ulong)format;
  if (*(long *)(in_FS_OFFSET + uVar2 * 8 + -0x140) == 0) {
    type = (coda_type_special *)malloc(0x58);
    if (type == (coda_type_special *)0x0) {
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x58,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                     ,0x8b6);
      return (coda_type_special *)0x0;
    }
    type->format = format;
    type->retain_count = 0;
    type->type_class = coda_special_class;
    type->read_type = coda_native_type_not_available;
    type->name = (char *)0x0;
    type->description = (char *)0x0;
    type->bit_size = 0;
    type->size_expr = (coda_expression *)0x0;
    *(undefined8 *)((long)&type->size_expr + 4) = 0;
    *(undefined8 *)((long)&type->attributes + 4) = 0;
    type->base_type = (coda_type *)0x0;
    type->unit = (char *)0x0;
    type->value_expr = (coda_expression *)0x0;
    type_00 = coda_type_raw_new(format);
    type->base_type = (coda_type *)type_00;
    if ((type_00 == (coda_type_raw *)0x0) ||
       (iVar1 = coda_type_set_bit_size((coda_type *)type_00,0), iVar1 != 0)) {
      special_delete(type);
      return (coda_type_special *)0x0;
    }
    *(coda_type_special **)(in_FS_OFFSET + uVar2 * 8 + -0x140) = type;
  }
  return *(coda_type_special **)(in_FS_OFFSET + uVar2 * 8 + -0x140);
}

Assistant:

coda_type_special *coda_type_no_data_singleton(coda_format format)
{
    assert(format < num_no_data_singletons);

    if (no_data_singleton[format] == NULL)
    {
        coda_type_special *type;

        type = (coda_type_special *)malloc(sizeof(coda_type_special));
        if (type == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (long)sizeof(coda_type_special), __FILE__, __LINE__);
            return NULL;
        }
        type->format = format;
        type->retain_count = 0;
        type->type_class = coda_special_class;
        type->read_type = coda_native_type_not_available;
        type->name = NULL;
        type->description = NULL;
        type->bit_size = 0;
        type->size_expr = NULL;
        type->attributes = NULL;
        type->special_type = coda_special_no_data;
        type->base_type = NULL;
        type->unit = NULL;
        type->value_expr = NULL;

        type->base_type = (coda_type *)coda_type_raw_new(format);
        if (type->base_type == NULL)
        {
            special_delete(type);
            return NULL;
        }
        if (coda_type_set_bit_size(type->base_type, 0) != 0)
        {
            special_delete(type);
            return NULL;
        }

        no_data_singleton[format] = type;
    }

    return no_data_singleton[format];
}